

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O2

void __thiscall MxxReduce_GlobalReduce_Test::TestBody(MxxReduce_GlobalReduce_Test *this)

{
  AssertHelper AVar1;
  int iVar2;
  size_type sVar3;
  size_type __n;
  _func_int **pp_Var4;
  char *message;
  long lVar5;
  AssertHelper local_f0;
  int bcast_rank;
  T result;
  datatype dt;
  custom_op<int> op;
  comm c;
  vector<long,_std::allocator<long>_> local;
  long totalsum;
  
  mxx::comm::comm(&c);
  if ((c.m_rank & 1U) == 0) {
    __n = (long)(c.m_rank >> 1) + 1;
    lVar5 = (long)(int)((long)(c.m_rank >> 1) * __n >> 1) + 1;
  }
  else {
    lVar5 = 1;
    __n = 0;
  }
  std::vector<long,_std::allocator<long>_>::vector(&local,__n,(allocator_type *)&op);
  for (sVar3 = 0; __n != sVar3; sVar3 = sVar3 + 1) {
    local.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
    [sVar3] = lVar5 + sVar3;
  }
  result = CONCAT44(result._4_4_,
                    (uint)(local.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_finish !=
                          local.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start));
  op._vptr_custom_op = (_func_int **)&PTR__custom_op_00142cc8;
  op.m_user_func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  op.m_user_func.super__Function_base._M_functor._8_8_ = 0;
  op.m_user_func.super__Function_base._M_manager = (_Manager_type)0x0;
  op.m_user_func._M_invoker = (_Invoker_type)0x0;
  op.m_builtin = false;
  dt.builtin = false;
  dt._17_7_ = 0;
  dt._vptr_datatype = (_func_int **)0x0;
  dt.mpitype = (MPI_Datatype)0x0;
  op.m_user_func.super__Function_base._M_functor._M_unused._M_object = operator_new(0x10);
  *(code **)op.m_user_func.super__Function_base._M_functor._M_unused._0_8_ =
       mxx::custom_op<int>::
       custom_function<mxx::global_reduce<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,MxxReduce_GlobalReduce_Test::TestBody()::__0>(__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,MxxReduce_GlobalReduce_Test::TestBody()::__0,mxx::comm_const&)::_lambda(int,int)_1_>
  ;
  op.m_user_func.super__Function_base._M_functor._8_8_ = dt.mpitype;
  dt._vptr_datatype = (_func_int **)0x0;
  dt.mpitype = (MPI_Datatype)0x0;
  dt.builtin = false;
  dt._17_7_ = 0;
  op.m_user_func.super__Function_base._M_manager =
       std::
       _Function_handler<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**),_std::_Bind<void_(*((lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/reduction.hpp:497:39),_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))((lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/reduction.hpp:497:39),_void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>
       ::_M_manager;
  op.m_user_func._M_invoker =
       std::
       _Function_handler<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**),_std::_Bind<void_(*((lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/reduction.hpp:497:39),_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>,_std::_Placeholder<4>))((lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/reduction.hpp:497:39),_void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&dt);
  dt._vptr_datatype = (_func_int **)&PTR__datatype_00142cf8;
  dt.mpitype = (MPI_Datatype)&ompi_mpi_int;
  dt.builtin = true;
  MPI_Type_dup(&ompi_mpi_int,&op.m_type_copy);
  local_f0.data_._0_4_ = 0x543;
  mxx::attr_map<int,_std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>::set
            (&op.m_type_copy,(int *)&local_f0,&op.m_user_func);
  MPI_Op_create(mxx::custom_op<int>::mpi_user_function,1,&op.m_op);
  mxx::datatype::~datatype(&dt);
  MPI_Allreduce(&result,&dt,1,op.m_type_copy,op.m_op,c.mpi_comm);
  iVar2 = (int)dt._vptr_datatype;
  mxx::custom_op<int>::~custom_op(&op);
  if (iVar2 != 0) {
    if (local.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      __assert_fail("n >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/reduction.hpp"
                    ,0x20a,
                    "typename std::iterator_traits<Iterator>::value_type mxx::global_reduce(Iterator, Iterator, Func, const mxx::comm &) [Iterator = __gnu_cxx::__normal_iterator<const long *, std::vector<long>>, Func = (lambda at /workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp:242:47)]"
                   );
    }
    local_f0.data_ =
         (AssertHelperData *)
         std::
         accumulate<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,long,MxxReduce_GlobalReduce_Test::TestBody()::__0>
                   (local.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start + 1,
                    local.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish,
                    *local.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start);
    mxx::custom_op<long>::custom_op<MxxReduce_GlobalReduce_Test::TestBody()::__0>
              ((custom_op<long> *)&op);
    MPI_Allreduce(&local_f0,&dt,1,op.m_type_copy,op.m_op,c.mpi_comm);
    pp_Var4 = dt._vptr_datatype;
    mxx::custom_op<long>::~custom_op((custom_op<long> *)&op);
    goto LAB_0010ce63;
  }
  mxx::comm::split((comm *)&dt,&c,
                   (uint)(local.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_finish !=
                         local.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start));
  if (local.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
     ) {
    if (dt._16_4_ != c.m_size) {
      bcast_rank = -1;
      goto LAB_0010ce04;
    }
    pp_Var4 = (_func_int **)0x0;
  }
  else {
    bcast_rank = -1;
    result = std::
             accumulate<__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,long,MxxReduce_GlobalReduce_Test::TestBody()::__0>
                       (local.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start + 1,
                        local.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish,
                        *local.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_start);
    mxx::custom_op<long>::custom_op<MxxReduce_GlobalReduce_Test::TestBody()::__0>
              ((custom_op<long> *)&op);
    local_f0.data_ = (AssertHelperData *)0x0;
    MPI_Reduce(&result,&local_f0,1,op.m_type_copy,op.m_op,0,dt.mpitype);
    AVar1.data_ = local_f0.data_;
    mxx::custom_op<long>::~custom_op((custom_op<long> *)&op);
    result = (T)AVar1.data_;
    if (dt._20_4_ == 0) {
      bcast_rank = c.m_rank;
    }
LAB_0010ce04:
    iVar2 = mxx::allreduce<int,mxx::max<int>>(&bcast_rank,&c);
    op._vptr_custom_op = (_func_int **)&PTR__datatype_00142cf8;
    op.m_user_func.super__Function_base._M_functor._M_unused._0_8_ = (undefined8)&ompi_mpi_long;
    op.m_user_func.super__Function_base._M_functor._M_pod_data[8] = 1;
    MPI_Bcast(&result,1,&ompi_mpi_long,iVar2,c.mpi_comm);
    pp_Var4 = (_func_int **)result;
    mxx::datatype::~datatype((datatype *)&op);
  }
  mxx::comm::~comm((comm *)&dt);
LAB_0010ce63:
  iVar2 = (c.m_size + 1) / 2;
  iVar2 = (iVar2 * (iVar2 + 1)) / 2;
  dt._vptr_datatype = (_func_int **)CONCAT44(dt._vptr_datatype._4_4_,(iVar2 * (iVar2 + 1)) / 2);
  totalsum = (long)pp_Var4;
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)&op,"num_els*(num_els+1)/2","totalsum",(int *)&dt,&totalsum);
  if ((char)op._vptr_custom_op == '\0') {
    testing::Message::Message((Message *)&dt);
    if (op.m_user_func.super__Function_base._M_functor._M_unused._M_object == (void *)0x0) {
      message = "";
    }
    else {
      message = *op.m_user_func.super__Function_base._M_functor._M_unused._M_object;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
               ,0xf5,message);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&dt);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&dt);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&op.m_user_func);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&local.super__Vector_base<long,_std::allocator<long>_>);
  mxx::comm::~comm(&c);
  return;
}

Assistant:

TEST(MxxReduce, GlobalReduce) {
    mxx::comm c;

    // test reduce with zero elements for some processes
    size_t n = 0;
    int presize = 0;
    if (c.rank() % 2 == 0) {
        n = (c.rank()/2+1);
        presize = n*(n-1)/2;
    }
    std::vector<long> local(n);
    for (size_t i = 0; i < n; ++i) {
        local[i] = presize + i + 1;
    }
    long totalsum = mxx::global_reduce(local, [](int x, int y){ return x+y; }, c);
    int nonzero_size = (c.size()+1)/2;
    int num_els = nonzero_size*(nonzero_size+1)/2;
    ASSERT_EQ(num_els*(num_els+1)/2, totalsum);
}